

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

void ps_lattice_link2itor(ps_seg_t *seg,ps_latlink_t *link,int to)

{
  logmath_t *lmath;
  ps_latlink_t *ppVar1;
  ps_latnode_s *ppVar2;
  ps_search_t *ppVar3;
  ngram_model_t *model;
  ps_latnode_s **pppVar4;
  int iVar5;
  ps_latlink_s *ppVar6;
  char *pcVar7;
  long lVar8;
  int32 w1;
  latlink_list_t *plVar9;
  int32 w2;
  ps_latnode_s *ppVar10;
  
  if (to == 0) {
    lmath = seg->search->acmod->lmath;
    ppVar10 = link->from;
    seg->ef = link->ef;
    seg->prob = (link->beta + link->alpha) - *(int *)&seg[1].search;
    for (ppVar2 = ppVar10; ppVar2 != (ps_latnode_s *)0x0; ppVar2 = ppVar2->alt) {
      for (plVar9 = ppVar2->exits; plVar9 != (latlink_list_t *)0x0; plVar9 = plVar9->next) {
        ppVar1 = plVar9->link;
        if (ppVar1 != link) {
          iVar5 = logmath_add(lmath,seg->prob,
                              (ppVar1->beta + ppVar1->alpha) - *(int *)&seg[1].search);
          seg->prob = iVar5;
        }
      }
    }
  }
  else {
    ppVar10 = link->to;
    seg->ef = ppVar10->lef;
    seg->prob = 0;
  }
  iVar5 = ppVar10->wid;
  if ((long)iVar5 < 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = seg->search->dict->word[iVar5].word;
  }
  seg->text = pcVar7;
  seg->wid = iVar5;
  seg->sf = ppVar10->sf;
  seg->ascr = link->ascr << 10;
  ppVar3 = seg->search;
  iVar5 = strcmp(ppVar3->type,"ngram");
  if (iVar5 == 0) {
    model = (ngram_model_t *)ppVar3[1].vt;
    ppVar6 = link->best_prev;
    if (ppVar6 == (ps_latlink_s *)0x0) {
      if (to == 0) {
        seg->lscr = 0;
        iVar5 = 1;
        lVar8 = 0x30;
        goto LAB_001127b1;
      }
      w2 = link->to->basewid;
      w1 = link->from->basewid;
LAB_001127a0:
      iVar5 = ngram_bg_score(model,w2,w1,&seg->lback);
    }
    else {
      if (to == 0) {
        pppVar4 = &ppVar6->from;
        ppVar6 = ppVar6->best_prev;
        w2 = link->from->basewid;
        w1 = (*pppVar4)->basewid;
        if (ppVar6 == (ps_latlink_s *)0x0) goto LAB_001127a0;
      }
      else {
        w2 = link->to->basewid;
        w1 = link->from->basewid;
      }
      iVar5 = ngram_tg_score(model,w2,w1,ppVar6->from->basewid,&seg->lback);
    }
    iVar5 = iVar5 >> 10;
  }
  else {
    seg->lback = 1;
    iVar5 = 0;
  }
  lVar8 = 0x28;
LAB_001127b1:
  *(int *)((long)&seg->vt + lVar8) = iVar5;
  return;
}

Assistant:

static void
ps_lattice_link2itor(ps_seg_t *seg, ps_latlink_t *link, int to)
{
    dag_seg_t *itor = (dag_seg_t *)seg;
    ps_latnode_t *node;

    if (to) {
        node = link->to;
        seg->ef = node->lef;
        seg->prob = 0; /* norm + beta - norm */
    }
    else {
        latlink_list_t *x;
        ps_latnode_t *n;
        logmath_t *lmath = ps_search_acmod(seg->search)->lmath;

        node = link->from;
        seg->ef = link->ef;
        seg->prob = link->alpha + link->beta - itor->norm;
        /* Sum over all exits for this word and any alternate
           pronunciations at the same frame. */
        for (n = node; n; n = n->alt) {
            for (x = n->exits; x; x = x->next) {
                if (x->link == link)
                    continue;
                seg->prob = logmath_add(lmath, seg->prob,
                                        x->link->alpha + x->link->beta - itor->norm);
            }
        }
    }
    seg->text = dict_wordstr(ps_search_dict(seg->search), node->wid);
    seg->wid = node->wid;
    seg->sf = node->sf;
    seg->ascr = link->ascr << SENSCR_SHIFT;
    /* Compute language model score from best predecessors. */
    ps_lattice_compute_lscr(seg, link, to);
}